

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Force(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_34;
  int c;
  int fVerbose;
  int fClustered;
  int nIters;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fVerbose = 0x14;
  c = 1;
  local_34 = 1;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"Icvh");
      if (iVar1 == -1) {
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9Force(): There is no AIG.\n");
          return 1;
        }
        For_ManExperiment(pAbc->pGia,fVerbose,c,local_34);
        return 0;
      }
      if (iVar1 == 0x49) break;
      if (iVar1 == 99) {
        c = c ^ 1;
      }
      else {
        if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_002ad27d;
        local_34 = local_34 ^ 1;
      }
    }
    if (argc <= globalUtilOptind) break;
    fVerbose = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if (fVerbose < 0) {
LAB_002ad27d:
      Abc_Print(-2,"usage: &force [-I <num>] [-cvh]\n");
      Abc_Print(-2,"\t         one-dimensional placement algorithm FORCE introduced by\n");
      Abc_Print(-2,anon_var_dwarf_55658);
      Abc_Print(-2,"\t-I num : the number of refinement iterations [default = %d]\n",
                (ulong)(uint)fVerbose);
      pcVar2 = "no";
      if (c != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-c     : toggle clustered representation [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (local_34 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
  goto LAB_002ad27d;
}

Assistant:

int Abc_CommandAbc9Force( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int nIters     = 20;
    int fClustered =  1;
    int fVerbose   =  1;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Icvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nIters < 0 )
                goto usage;
            break;
        case 'c':
            fClustered ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Force(): There is no AIG.\n" );
        return 1;
    }
    For_ManExperiment( pAbc->pGia, nIters, fClustered, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &force [-I <num>] [-cvh]\n" );
    Abc_Print( -2, "\t         one-dimensional placement algorithm FORCE introduced by\n" );
    Abc_Print( -2, "\t         F. A. Aloul, I. L. Markov, and K. A. Sakallah (GLSVLSI�03).\n" );
    Abc_Print( -2, "\t-I num : the number of refinement iterations [default = %d]\n", nIters );
    Abc_Print( -2, "\t-c     : toggle clustered representation [default = %s]\n", fClustered? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}